

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::to_interpolation_qualifiers_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,Bitset *flags)

{
  bool bVar1;
  CompilerError *pCVar2;
  allocator local_149;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_a9;
  string local_a8;
  allocator local_81;
  string local_80;
  allocator local_59;
  string local_58;
  undefined1 local_21;
  Bitset *local_20;
  Bitset *flags_local;
  CompilerGLSL *this_local;
  string *res;
  
  local_21 = 0;
  local_20 = flags;
  flags_local = (Bitset *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = Bitset::get(local_20,0xe);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"flat ");
  }
  bVar1 = Bitset::get(local_20,0xd);
  if (bVar1) {
    if (((this->options).es & 1U) == 0) {
      bVar1 = is_legacy_desktop(this);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_80,"GL_EXT_gpu_shader4",&local_81);
        require_extension_internal(this,&local_80);
        ::std::__cxx11::string::~string((string *)&local_80);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
    }
    else {
      if ((this->options).version < 300) {
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar2,"noperspective requires ESSL 300.");
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_58,"GL_NV_shader_noperspective_interpolation",&local_59);
      require_extension_internal(this,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    }
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"noperspective ");
  }
  bVar1 = Bitset::get(local_20,0x10);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"centroid ");
  }
  bVar1 = Bitset::get(local_20,0xf);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"patch ");
  }
  bVar1 = Bitset::get(local_20,0x11);
  if (bVar1) {
    if (((this->options).es & 1U) != 0) {
      if ((this->options).version < 300) {
        pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar2,"sample requires ESSL 300.");
        __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((this->options).version < 0x140) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_a8,"GL_OES_shader_multisample_interpolation",&local_a9);
        require_extension_internal(this,&local_a8);
        ::std::__cxx11::string::~string((string *)&local_a8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      }
    }
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"sample ");
  }
  bVar1 = Bitset::get(local_20,0x12);
  if ((bVar1) && ((((this->options).es & 1U) != 0 || (0x77 < (this->options).version)))) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"invariant ");
  }
  bVar1 = Bitset::get(local_20,0x1497);
  if (bVar1) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"perprimitiveEXT ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_d0,"GL_EXT_mesh_shader",&local_d1);
    require_extension_internal(this,&local_d0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  bVar1 = Bitset::get(local_20,4999);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_f8,"GL_AMD_shader_explicit_vertex_parameter",&local_f9);
    require_extension_internal(this,&local_f8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"__explicitInterpAMD ");
  }
  bVar1 = Bitset::get(local_20,0x14a5);
  if (bVar1) {
    if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x140)) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar2,"pervertexEXT requires ESSL 320.");
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1c2)) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar2,"pervertexEXT requires GLSL 450.");
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((this->barycentric_is_nv & 1U) == 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_148,"GL_EXT_fragment_shader_barycentric",&local_149);
      require_extension_internal(this,&local_148);
      ::std::__cxx11::string::~string((string *)&local_148);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_149);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"pervertexEXT ");
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_120,"GL_NV_fragment_shader_barycentric",&local_121);
      require_extension_internal(this,&local_120);
      ::std::__cxx11::string::~string((string *)&local_120);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"pervertexNV ");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_interpolation_qualifiers(const Bitset &flags)
{
	string res;
	//if (flags & (1ull << DecorationSmooth))
	//    res += "smooth ";
	if (flags.get(DecorationFlat))
		res += "flat ";
	if (flags.get(DecorationNoPerspective))
	{
		if (options.es)
		{
			if (options.version < 300)
				SPIRV_CROSS_THROW("noperspective requires ESSL 300.");
			require_extension_internal("GL_NV_shader_noperspective_interpolation");
		}
		else if (is_legacy_desktop())
			require_extension_internal("GL_EXT_gpu_shader4");
		res += "noperspective ";
	}
	if (flags.get(DecorationCentroid))
		res += "centroid ";
	if (flags.get(DecorationPatch))
		res += "patch ";
	if (flags.get(DecorationSample))
	{
		if (options.es)
		{
			if (options.version < 300)
				SPIRV_CROSS_THROW("sample requires ESSL 300.");
			else if (options.version < 320)
				require_extension_internal("GL_OES_shader_multisample_interpolation");
		}
		res += "sample ";
	}
	if (flags.get(DecorationInvariant) && (options.es || options.version >= 120))
		res += "invariant ";
	if (flags.get(DecorationPerPrimitiveEXT))
	{
		res += "perprimitiveEXT ";
		require_extension_internal("GL_EXT_mesh_shader");
	}

	if (flags.get(DecorationExplicitInterpAMD))
	{
		require_extension_internal("GL_AMD_shader_explicit_vertex_parameter");
		res += "__explicitInterpAMD ";
	}

	if (flags.get(DecorationPerVertexKHR))
	{
		if (options.es && options.version < 320)
			SPIRV_CROSS_THROW("pervertexEXT requires ESSL 320.");
		else if (!options.es && options.version < 450)
			SPIRV_CROSS_THROW("pervertexEXT requires GLSL 450.");

		if (barycentric_is_nv)
		{
			require_extension_internal("GL_NV_fragment_shader_barycentric");
			res += "pervertexNV ";
		}
		else
		{
			require_extension_internal("GL_EXT_fragment_shader_barycentric");
			res += "pervertexEXT ";
		}
	}

	return res;
}